

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O2

uchar * push_bytes(uchar **cursor,size_t *max,void *src,size_t len)

{
  uchar *__dest;
  ulong __n;
  
  if ((cursor == (uchar **)0x0) || (__dest = *cursor, __dest == (uchar *)0x0)) {
    *max = *max + len;
  }
  else {
    __n = *max;
    if (len <= __n) {
      if (src != (void *)0x0) {
        memcpy(__dest,src,len);
        __dest = *cursor;
        __n = *max;
      }
      *cursor = __dest + len;
      *max = __n - len;
      return __dest;
    }
    if (src != (void *)0x0) {
      memcpy(__dest,src,__n);
      __n = *max;
    }
    *max = len - __n;
    *cursor = (uchar *)0x0;
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *push_bytes(unsigned char **cursor, size_t *max,
                          const void *src, size_t len)
{
    if (cursor == NULL || *cursor == NULL) {
        *max += len;
        return NULL;
    }
    if (len > *max) {
        if (src)
            memcpy(*cursor, src, *max);
        /* From now on, max records the room we *needed* */
        *max = len - *max;
        *cursor = NULL;
        return NULL;
    }
    if (src)
        memcpy(*cursor, src, len);

    *cursor += len;
    *max -= len;

    return *cursor - len;
}